

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Sfm_DecVarCost(Sfm_Dec_t *p,word (*Masks) [8],int d,int (*Counts) [2])

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  
  if (-1 < d) {
    uVar2 = d * 8;
    lVar5 = 0;
    while( true ) {
      uVar8 = p->vSets[lVar5].nSize;
      if (uVar8 == uVar2 || SBORROW4(uVar8,uVar2) != (int)(uVar8 + d * -8) < 0) break;
      lVar7 = (long)p->nPatWords[lVar5];
      uVar8 = 0;
      iVar4 = 0;
      if (0 < lVar7) {
        lVar6 = 0;
        iVar4 = 0;
        do {
          uVar1 = (*Masks)[lVar6] - ((*Masks)[lVar6] >> 1 & 0x5555555555555555);
          uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
          uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
          uVar1 = (uVar1 >> 8) + uVar1;
          lVar3 = (uVar1 >> 0x10) + uVar1;
          iVar4 = iVar4 + ((int)((ulong)lVar3 >> 0x20) + (int)lVar3 & 0xffU);
          lVar6 = lVar6 + 1;
        } while (lVar7 != lVar6);
      }
      if (0 < p->nPatWords[lVar5]) {
        lVar6 = 0;
        uVar8 = 0;
        do {
          uVar1 = p->vSets[lVar5].pArray[(ulong)uVar2 + lVar6] & (*Masks)[lVar6];
          uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
          uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
          uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
          uVar1 = (uVar1 >> 8) + uVar1;
          lVar3 = (uVar1 >> 0x10) + uVar1;
          uVar8 = uVar8 + ((int)((ulong)lVar3 >> 0x20) + (int)lVar3 & 0xffU);
          lVar6 = lVar6 + 1;
        } while (lVar7 != lVar6);
      }
      Counts[lVar5][1] = uVar8;
      Counts[lVar5][0] = iVar4 - uVar8;
      if ((int)(iVar4 - uVar8 | uVar8) < 0) {
        __assert_fail("Counts[c][0] >= 0 && Counts[c][1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x274,"void Sfm_DecVarCost(Sfm_Dec_t *, word (*)[8], int, int (*)[2])");
      }
      Masks = Masks + 1;
      bVar9 = lVar5 != 0;
      lVar5 = lVar5 + 1;
      if (bVar9) {
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

void Sfm_DecVarCost( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS], int d, int Counts[2][2] )
{
    int c; 
    for ( c = 0; c < 2; c++ )
    {
        word * pPats = Sfm_DecDivPats( p, d, c );
        int Num = Abc_TtCountOnesVec( Masks[c], p->nPatWords[c] );
        Counts[c][1] = Abc_TtCountOnesVecMask( pPats, Masks[c], p->nPatWords[c], 0 );
        Counts[c][0] = Num - Counts[c][1];
        assert( Counts[c][0] >= 0 && Counts[c][1] >= 0 );
    }
    //printf( "%5d %5d   %5d %5d \n", Counts[0][0], Counts[0][1], Counts[1][0], Counts[1][1] );
}